

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

void __thiscall icu_63::ICUService::reset(ICUService *this)

{
  umtx_lock_63((UMutex *)lock);
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x10])(this);
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[0x12])(this);
  umtx_unlock_63((UMutex *)lock);
  (*(this->super_ICUNotifier)._vptr_ICUNotifier[4])(this);
  return;
}

Assistant:

void 
ICUService::reset() 
{
    {
        Mutex mutex(&lock);
        reInitializeFactories();
        clearCaches();
    }
    notifyChanged();
}